

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_reaction_diffusion_mri.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  FILE *pFVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  SUNContext ctx;
  MRIStepInnerStepper inner_stepper;
  sunrealtype t;
  undefined8 local_80;
  undefined8 local_78;
  long local_70;
  undefined8 local_68;
  long local_60;
  undefined8 *local_58;
  undefined8 local_50;
  double local_48;
  long local_40;
  long local_38;
  
  local_78 = 0;
  uVar1 = SUNContext_Create(0,&local_80);
  if ((int)uVar1 < 0) {
    pcVar6 = "SUNContext_Create";
    goto LAB_00101989;
  }
  puVar2 = (undefined8 *)malloc(0x20);
  *puVar2 = 0x3e9;
  puVar2[1] = 0x3f747ae147ae147b;
  puVar2[2] = 0x3f847ae147ae147b;
  puVar2[3] = 0x401c48c6001f0ac0;
  puts("\n1D reaction-diffusion PDE test problem:");
  printf("  N = %li\n",0x3e9);
  printf("  diffusion coefficient:  k = %g\n",0x47ae147b);
  lVar3 = N_VNew_Serial(0x3e9,local_80);
  if (lVar3 == 0) {
    main_cold_4();
    return 1;
  }
  lVar4 = N_VGetArrayPointer(lVar3);
  if (lVar4 == 0) {
    main_cold_3();
    return 1;
  }
  lVar8 = 0;
  do {
    dVar9 = exp(((double)lVar8 * 0.005 + -1.0) * 7.0710678118654755);
    *(double *)(lVar4 + lVar8 * 8) = 1.0 / (dVar9 + 1.0);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x3e9);
  lVar4 = ARKStepCreate(0,ff,0,lVar3,local_80);
  local_40 = lVar4;
  if (lVar4 == 0) {
    main_cold_2();
    return 1;
  }
  uVar1 = ARKodeSetUserData(lVar4,puVar2);
  if ((int)uVar1 < 0) {
LAB_001018cd:
    pcVar6 = "ARKodeSetUserData";
  }
  else {
    uVar1 = ARKStepSetTableNum(lVar4,0xffffffff,0xc);
    if ((int)uVar1 < 0) {
      pcVar6 = "ARKStepSetTableNum";
      goto LAB_00101989;
    }
    uVar1 = ARKodeSetFixedStep(0x88e368f1,lVar4);
    if (-1 < (int)uVar1) {
      uVar1 = ARKStepCreateMRIStepInnerStepper(lVar4,&local_78);
      if ((int)uVar1 < 0) {
        pcVar6 = "ARKStepCreateMRIStepInnerStepper";
        goto LAB_00101989;
      }
      lVar8 = MRIStepCreate(0,fs,0,lVar3,local_78,local_80);
      local_38 = lVar8;
      if (lVar8 == 0) {
        main_cold_1();
        return 1;
      }
      uVar1 = ARKodeSetUserData(lVar8,puVar2);
      if ((int)uVar1 < 0) goto LAB_001018cd;
      uVar1 = ARKodeSetFixedStep(0xd2f1a9fc,lVar8);
      if (-1 < (int)uVar1) {
        uVar1 = ARKodeSetMaxNumSteps(lVar8,10000);
        if (-1 < (int)uVar1) {
          local_70 = lVar8;
          local_60 = lVar4;
          pFVar5 = fopen("heat_mesh.txt","w");
          lVar4 = 0;
          do {
            fprintf(pFVar5,"  %.16e\n",SUB84((double)lVar4 * (double)puVar2[1],0));
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x3e9);
          local_58 = puVar2;
          fclose(pFVar5);
          pFVar5 = fopen("heat1D.txt","w");
          lVar4 = N_VGetArrayPointer(lVar3);
          lVar8 = 0;
          do {
            fprintf(pFVar5," %.16e",(int)*(undefined8 *)(lVar4 + lVar8 * 8));
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x3e9);
          fputc(10,pFVar5);
          local_68 = 0;
          puts("        t      ||u||_rms");
          puts("   -------------------------");
          dVar9 = (double)N_VDotProd(lVar3,lVar3);
          dVar9 = dVar9 / 1001.0;
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          printf("  %10.6f  %10.6f\n",0,dVar9);
          dVar9 = 0.1;
          iVar7 = 0;
          do {
            local_48 = dVar9;
            uVar1 = ARKodeEvolve(local_70,lVar3,&local_68,1);
            if ((int)uVar1 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","ARKodeEvolve",
                      (ulong)uVar1);
              break;
            }
            local_50 = local_68;
            dVar9 = (double)N_VDotProd(lVar3,lVar3);
            dVar9 = dVar9 / 1001.0;
            if (dVar9 < 0.0) {
              dVar9 = sqrt(dVar9);
            }
            else {
              dVar9 = SQRT(dVar9);
            }
            printf("  %10.6f  %10.6f\n",(int)local_50,dVar9);
            lVar8 = 0;
            do {
              fprintf(pFVar5," %.16e",(int)*(undefined8 *)(lVar4 + lVar8 * 8));
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x3e9);
            fputc(10,pFVar5);
            dVar9 = 3.0;
            if (local_48 + 0.1 <= 3.0) {
              dVar9 = local_48 + 0.1;
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != 0x1e);
          puts("   -------------------------");
          fclose(pFVar5);
          puts("\nFinal Slow Statistics:");
          lVar4 = local_70;
          ARKodePrintAllStats(local_70,_stdout,0);
          puts("\nFinal Fast Statistics:");
          lVar8 = local_60;
          ARKodePrintAllStats(local_60,_stdout,0);
          pFVar5 = fopen("ark_reaction_diffusion_mri_slow_stats.csv","w");
          ARKodePrintAllStats(lVar4,pFVar5,1);
          fclose(pFVar5);
          pFVar5 = fopen("ark_reaction_diffusion_mri_fast_stats.csv","w");
          ARKodePrintAllStats(lVar8,pFVar5,1);
          fclose(pFVar5);
          N_VDestroy(lVar3);
          ARKodeFree(&local_40);
          MRIStepInnerStepper_Free(&local_78);
          ARKodeFree(&local_38);
          free(local_58);
          SUNContext_Free(&local_80);
          return 0;
        }
        pcVar6 = "ARKodeSetMaxNumSteps";
        goto LAB_00101989;
      }
    }
    pcVar6 = "ARKodeSetFixedStep";
  }
LAB_00101989:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar6,(ulong)uVar1);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(3.0);       /* final time */
  sunrealtype dTout = SUN_RCONST(0.1);       /* time between outputs */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunrealtype hs    = SUN_RCONST(0.001);     /* slow step size */
  sunrealtype hf    = SUN_RCONST(0.00002);   /* fast step size */
  UserData udata    = NULL;                  /* user data */

  sunrealtype* data;                /* array for solution output */
  sunrealtype L  = SUN_RCONST(5.0); /* domain length */
  sunindextype N = 1001;            /* number of mesh points */
  sunrealtype ep = SUN_RCONST(1e-2);
  sunindextype i;

  /* general problem variables */
  int retval;                    /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for storing solution */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  void* inner_arkode_mem = NULL; /* empty ARKode memory structure */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper */
  FILE *FID, *UFID;
  sunrealtype t, tout;
  int iout;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /*
   * Initialization
   */

  /* allocate and fill user data structure */
  udata      = (UserData)malloc(sizeof(*udata));
  udata->N   = N;
  udata->dx  = L / (SUN_RCONST(1.0) * N - SUN_RCONST(1.0));
  udata->k   = SUN_RCONST(1e-4) / ep;
  udata->lam = SUN_RCONST(0.5) * sqrt(SUN_RCONST(2.0) * ep * SUN_RCONST(1e4));

  /* Initial problem output */
  printf("\n1D reaction-diffusion PDE test problem:\n");
  printf("  N = %li\n", (long int)udata->N);
  printf("  diffusion coefficient:  k = %" GSYM "\n", udata->k);

  /* Create and initialize serial vector for the solution */
  y = N_VNew_Serial(N, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }

  retval = SetInitialCondition(y, udata);
  if (check_retval(&retval, "SetInitialCondition", 1)) { return 1; }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the fast integrator. Specify the explicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(ff, NULL, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Attach user data to fast integrator */
  retval = ARKodeSetUserData(inner_arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, -1, ARKODE_KNOTH_WOLKE_3_3);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Set the fast step size */
  retval = ARKodeSetFixedStep(inner_arkode_mem, hf);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKStepCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKStepCreateMRIStepInnerStepper", 1))
  {
    return 1;
  }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Pass udata to user functions */
  retval = ARKodeSetUserData(arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Increase max num steps  */
  retval = ARKodeSetMaxNumSteps(arkode_mem, 10000);
  if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }

  /*
   * Integrate ODE
   */

  /* output mesh to disk */
  FID = fopen("heat_mesh.txt", "w");
  for (i = 0; i < N; i++) { fprintf(FID, "  %.16" ESYM "\n", udata->dx * i); }
  fclose(FID);

  /* Open output stream for results, access data array */
  UFID = fopen("heat1D.txt", "w");
  data = N_VGetArrayPointer(y);

  /* output initial condition to disk */
  for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", data[i]); }
  fprintf(UFID, "\n");

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results. Stops when the final time has been reached */
  t     = T0;
  dTout = (Tf - T0) / Nt;
  tout  = T0 + dTout;
  printf("        t      ||u||_rms\n");
  printf("   -------------------------\n");
  printf("  %10.6" FSYM "  %10.6f\n", t, sqrt(N_VDotProd(y, y) / N));
  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* print solution stats and output results to disk */
    printf("  %10.6" FSYM "  %10.6f\n", t, sqrt(N_VDotProd(y, y) / N));
    for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", data[i]); }
    fprintf(UFID, "\n");

    /* successful solve: update output time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   -------------------------\n");
  fclose(UFID);

  /* Print final statistics to the screen */
  printf("\nFinal Slow Statistics:\n");
  retval = ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  printf("\nFinal Fast Statistics:\n");
  retval = ARKodePrintAllStats(inner_arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("ark_reaction_diffusion_mri_slow_stats.csv", "w");
  retval = ARKodePrintAllStats(arkode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);
  FID    = fopen("ark_reaction_diffusion_mri_fast_stats.csv", "w");
  retval = ARKodePrintAllStats(inner_arkode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Clean up and return */
  N_VDestroy(y);                            /* Free y vector */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  free(udata);                              /* Free user data */
  SUNContext_Free(&ctx);                    /* Free context */

  return 0;
}